

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

optional<double> slang::parseDouble(string_view name,string_view value,string *error)

{
  size_t *pos_00;
  slang *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  ulong extraout_XMM0_Qa;
  string_view fmt;
  string_view fmt_00;
  string_view str;
  _Optional_payload_base<double> _Var2;
  format_args args;
  format_args args_00;
  size_t pos;
  string local_68;
  string local_48;
  _Storage<double,_true> _Var1;
  
  local_68._M_dataplus._M_p = name._M_str;
  local_68._M_string_length = name._M_len;
  pos_00 = (size_t *)value._M_str;
  this = (slang *)value._M_len;
  if (this == (slang *)0x0) {
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x20;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_48,(v11 *)"expected value for argument \'{}\'",fmt_00,args_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (error,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    _Var2._8_8_ = 0;
    _Var2._M_payload._M_value = (double)extraout_XMM0_Qa;
  }
  else {
    str._M_str = (char *)&pos;
    str._M_len = (size_t)pos_00;
    _Var2 = (_Optional_payload_base<double>)strToDouble(this,str,pos_00);
    _Var1 = _Var2._M_payload;
    if ((((undefined1  [16])_Var2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       ((slang *)pos != this)) {
      fmt.size_ = 0xdd;
      fmt.data_ = (char *)0x2a;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_48;
      local_48._M_dataplus._M_p = (pointer)pos_00;
      local_48._M_string_length = (size_type)this;
      local_48.field_2._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
      local_48.field_2._8_8_ = local_68._M_string_length;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_68,(v11 *)"invalid value \'{}\' for float argument \'{}\'",fmt,args);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (error,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      _Var2._8_8_ = 0;
      _Var2._M_payload = _Var1;
    }
  }
  return (_Optional_base<double,_true,_true>)(_Optional_base<double,_true,_true>)_Var2;
}

Assistant:

static std::optional<double> parseDouble(std::string_view name, std::string_view value,
                                         std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    size_t pos;
    std::optional<double> val = strToDouble(value, &pos);
    if (!val || pos != value.size()) {
        error = fmt::format("invalid value '{}' for float argument '{}'", value, name);
        return {};
    }

    return val;
}